

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cSparseTextureTests.cpp
# Opt level: O0

bool __thiscall
gl4cts::SparseTextureCommitmentTestCase::prepareTexture
          (SparseTextureCommitmentTestCase *this,Functions *gl,GLint target,GLint format,
          GLuint *texture)

{
  GLint GVar1;
  TextureFormat TVar2;
  GLuint *texture_local;
  GLint format_local;
  GLint target_local;
  Functions *gl_local;
  SparseTextureCommitmentTestCase *this_local;
  
  gl4cts::Texture::Generate(gl,texture);
  gl4cts::Texture::Bind(gl,*texture,target);
  GVar1 = SparseTextureUtils::getTargetDepth(target);
  (this->mState).minDepth = GVar1;
  SparseTextureUtils::getTexturePageSizes
            (gl,target,format,&(this->mState).pageSizeX,&(this->mState).pageSizeY,
             &(this->mState).pageSizeZ);
  if ((target == 0x8513) || (target == 0x9009)) {
    if ((this->mState).pageSizeY < (this->mState).pageSizeX) {
      (this->mState).pageSizeY = (this->mState).pageSizeX;
    }
    else if ((this->mState).pageSizeX < (this->mState).pageSizeY) {
      (this->mState).pageSizeX = (this->mState).pageSizeY;
    }
  }
  (this->mState).width = (this->mState).pageSizeX << 1;
  (this->mState).height = (this->mState).pageSizeY << 1;
  (this->mState).depth = (this->mState).pageSizeZ * 2 * (this->mState).minDepth;
  TVar2 = glu::mapGLInternalFormat(format);
  (this->mState).format = TVar2;
  return true;
}

Assistant:

bool SparseTextureCommitmentTestCase::prepareTexture(const Functions& gl, GLint target, GLint format, GLuint& texture)
{
	Texture::Generate(gl, texture);
	Texture::Bind(gl, texture, target);

	mState.minDepth = SparseTextureUtils::getTargetDepth(target);
	SparseTextureUtils::getTexturePageSizes(gl, target, format, mState.pageSizeX, mState.pageSizeY, mState.pageSizeZ);

	//The <width> and <height> has to be equal for cube map textures
	if (target == GL_TEXTURE_CUBE_MAP || target == GL_TEXTURE_CUBE_MAP_ARRAY)
	{
		if (mState.pageSizeX > mState.pageSizeY)
			mState.pageSizeY = mState.pageSizeX;
		else if (mState.pageSizeX < mState.pageSizeY)
			mState.pageSizeX = mState.pageSizeY;
	}

	mState.width  = 2 * mState.pageSizeX;
	mState.height = 2 * mState.pageSizeY;
	mState.depth  = 2 * mState.pageSizeZ * mState.minDepth;

	mState.format = glu::mapGLInternalFormat(format);

	return true;
}